

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O1

void PrefAdSize(PDISASM pMyDisasm)

{
  REX_Struct *pRVar1;
  Int32 *pIVar2;
  ulong uVar3;
  UIntPtr UVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar3 == 0) || ((pMyDisasm->Reserved_).EIP_ + 2 <= uVar3)) {
    (pMyDisasm->Prefix).AddressSize = '\x01';
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    pRVar1 = &(pMyDisasm->Reserved_).REX;
    if (((pMyDisasm->Reserved_).REX.state == '\x01') && (pRVar1->W_ == '\x01')) {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    }
    (pMyDisasm->Reserved_).REX.state = '\0';
    pRVar1->W_ = '\0';
    pRVar1->R_ = '\0';
    pRVar1->X_ = '\0';
    pRVar1->B_ = '\0';
    UVar4 = (pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Reserved_).EIP_ = UVar4 + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    pIVar2 = &(pMyDisasm->Reserved_).NB_PREFIX;
    *pIVar2 = *pIVar2 + 1;
    iVar5 = (pMyDisasm->Reserved_).AddressSize;
    iVar6 = iVar5 * 2;
    if ((pMyDisasm->Reserved_).Architecture != 0x10) {
      iVar6 = iVar5 >> 1;
    }
    (pMyDisasm->Reserved_).AddressSize = iVar6;
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(UVar4 + 1);
    (*opcode_map1[*(byte *)(UVar4 + 1)])(pMyDisasm);
    iVar5 = (pMyDisasm->Reserved_).AddressSize;
    if ((pMyDisasm->Reserved_).Architecture == 0x10) {
      iVar5 = iVar5 >> 1;
    }
    else {
      iVar5 = iVar5 * 2;
    }
    (pMyDisasm->Reserved_).AddressSize = iVar5;
  }
  else {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  return;
}

Assistant:

void __bea_callspec__ PrefAdSize(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    pMyDisasm->Prefix.AddressSize = InUsePrefix;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    if (GV.Architecture == 16) {
        GV.AddressSize = GV.AddressSize << 1;
    }
    else {
        GV.AddressSize = GV.AddressSize >> 1;
    }

    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
    if (GV.Architecture == 16) {
        GV.AddressSize = GV.AddressSize >> 1;
    }
    else {
        GV.AddressSize = GV.AddressSize << 1;
    }

}